

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

int Gia_ManCoLargestSupp(Gia_Man_t *p,Vec_Wec_t *vSupps)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  int iVar5;
  int v;
  
  iVar4 = -1;
  v = 0;
  iVar5 = -1;
  while( true ) {
    if (p->vCos->nSize <= v) {
      return iVar4;
    }
    pGVar2 = Gia_ManCo(p,v);
    if (pGVar2 == (Gia_Obj_t *)0x0) break;
    pVVar3 = Vec_WecEntry(vSupps,v);
    iVar1 = pVVar3->nSize;
    if (iVar5 < iVar1) {
      iVar4 = v;
    }
    if (iVar5 <= iVar1) {
      iVar5 = iVar1;
    }
    v = v + 1;
  }
  return iVar4;
}

Assistant:

int Gia_ManCoLargestSupp( Gia_Man_t * p, Vec_Wec_t * vSupps )
{
    Gia_Obj_t * pObj; 
    Vec_Int_t * vSuppOne;
    int i, iCoMax = -1, nSuppMax = -1;
    Gia_ManForEachCo( p, pObj, i )
    {
        vSuppOne = Vec_WecEntry( vSupps, i );
        if ( nSuppMax < Vec_IntSize(vSuppOne) )
        {
            nSuppMax = Vec_IntSize(vSuppOne);
            iCoMax = i;
        }
    }
    return iCoMax;
}